

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopDup(Kit_Sop_t *cResult,Kit_Sop_t *cSop,Vec_Int_t *vMemory)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  
  cResult->nCubes = 0;
  puVar3 = Vec_IntFetch(vMemory,cSop->nCubes);
  cResult->pCubes = puVar3;
  for (lVar4 = 0; (lVar4 < cSop->nCubes && (uVar1 = cSop->pCubes[lVar4], uVar1 != 0));
      lVar4 = lVar4 + 1) {
    iVar2 = cResult->nCubes;
    cResult->nCubes = iVar2 + 1;
    puVar3[iVar2] = uVar1;
  }
  return;
}

Assistant:

void Kit_SopDup( Kit_Sop_t * cResult, Kit_Sop_t * cSop, Vec_Int_t * vMemory )
{
    unsigned uCube;
    int i;
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    // add the cubes
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopPushCube( cResult, uCube );
}